

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

string * returnUngapped(string *__return_storage_ptr__,string *input_sequence,
                       string *consensus_structure)

{
  char cVar1;
  char y;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  _Head_base<1UL,_int,_false> _Var8;
  ulong uVar9;
  tuple<char,_int> local_c0;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> lts;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> cb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> sb;
  vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> paren;
  
  uVar7 = (uint)consensus_structure->_M_string_length;
  paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0;
  uVar6 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar6 = uVar9;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    cVar1 = (consensus_structure->_M_dataplus)._M_p[uVar9];
    if (cVar1 == '}') {
      if (cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = cb.
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                  (&cb,cb.
                       super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
LAB_00113149:
        pcVar2 = (input_sequence->_M_dataplus)._M_p;
        cVar1 = pcVar2[uVar9];
        y = pcVar2[iVar5];
        bVar3 = canMatch(cVar1,y);
        if ((!bVar3) &&
           ((cVar1 == '-' || ((consensus_structure->_M_dataplus)._M_p[uVar9] = '.', y != '-')))) {
          (consensus_structure->_M_dataplus)._M_p[iVar5] = '.';
        }
      }
    }
    else if (cVar1 == ')') {
      if (paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = paren.
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                  (&paren,paren.
                          super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
        goto LAB_00113149;
      }
    }
    else {
      _Var8._M_head_impl = (int)uVar9;
      if (cVar1 == '<') {
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             '<';
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&lts,
                   &local_c0);
      }
      else if (cVar1 == '>') {
        if (lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          iVar5 = lts.
                  super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                    (&lts,lts.
                          super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
          goto LAB_00113149;
        }
      }
      else if (cVar1 == '[') {
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             '[';
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&sb,
                   &local_c0);
      }
      else if (cVar1 == ']') {
        if (sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          iVar5 = sb.
                  super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                    (&sb,sb.
                         super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
          goto LAB_00113149;
        }
      }
      else if (cVar1 == '{') {
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             '{';
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&cb,
                   &local_c0);
      }
      else if (cVar1 == '(') {
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
             '(';
        local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
        std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
        emplace_back<std::tuple<char,int>>
                  ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&paren,
                   &local_c0);
      }
    }
  }
  if ((((paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       (lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish)) ||
      (sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl
       .super__Vector_impl_data._M_start !=
       sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl
       .super__Vector_impl_data._M_finish)) ||
     (cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Error in reported structure. More left pairings than right pairings");
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(0);
  }
  uVar7 = (uint)input_sequence->_M_string_length;
  while (uVar7 = uVar7 - 1, -1 < (int)uVar7) {
    if ((input_sequence->_M_dataplus)._M_p[uVar7 & 0x7fffffff] == '-') {
      std::__cxx11::string::erase((ulong)consensus_structure,(ulong)(uVar7 & 0x7fffffff));
    }
  }
  uVar9 = 0;
  do {
    if (uVar6 == uVar9) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)consensus_structure);
      std::_Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
      ~_Vector_base(&lts.
                     super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                   );
      std::_Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
      ~_Vector_base(&cb.
                     super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                   );
      std::_Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
      ~_Vector_base(&sb.
                     super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                   );
      std::_Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
      ~_Vector_base(&paren.
                     super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                   );
      return __return_storage_ptr__;
    }
    cVar1 = (consensus_structure->_M_dataplus)._M_p[uVar9];
    _Var8._M_head_impl = (int)uVar9;
    if (cVar1 == '}') {
      if (cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          cb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = cb.
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                  (&cb,cb.
                       super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
LAB_00113353:
        if (_Var8._M_head_impl - iVar5 < 4) {
          (consensus_structure->_M_dataplus)._M_p[uVar9] = '.';
          (consensus_structure->_M_dataplus)._M_p[iVar5] = '.';
        }
      }
    }
    else if (cVar1 == ')') {
      if (paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          paren.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = paren.
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                  (&paren,paren.
                          super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
        goto LAB_00113353;
      }
    }
    else if (cVar1 == '<') {
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
           '<';
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
      std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
      emplace_back<std::tuple<char,int>>
                ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&lts,&local_c0
                );
    }
    else if (cVar1 == '>') {
      if (lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          lts.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = lts.
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                  (&lts,lts.
                        super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
        goto LAB_00113353;
      }
    }
    else if (cVar1 == '[') {
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
           '[';
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
      std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
      emplace_back<std::tuple<char,int>>
                ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&sb,&local_c0)
      ;
    }
    else if (cVar1 == ']') {
      if (sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          sb.super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        iVar5 = sb.
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super__Tuple_impl<0UL,_char,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
        std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::erase
                  (&sb,sb.
                       super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
        goto LAB_00113353;
      }
    }
    else if (cVar1 == '{') {
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
           '{';
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
      std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
      emplace_back<std::tuple<char,int>>
                ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&cb,&local_c0)
      ;
    }
    else if (cVar1 == '(') {
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Head_base<0UL,_char,_false>._M_head_impl =
           '(';
      local_c0.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)_Var8._M_head_impl;
      std::vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
      emplace_back<std::tuple<char,int>>
                ((vector<std::tuple<char,int>,std::allocator<std::tuple<char,int>>> *)&paren,
                 &local_c0);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

std::string returnUngapped(std::string input_sequence, std::string consensus_structure){
    int length = consensus_structure.length();

    std::vector<std::tuple<char,int> > paren;
    std::vector<std::tuple<char,int> > sb;
    std::vector<std::tuple<char,int> > cb;
    std::vector<std::tuple<char,int> > lts;
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        // Checks to see if the pair can match
        if(close){
            if(canMatch(input_sequence[i],input_sequence[std::get<1>(x)])){
                
                continue;
            }
            else{
                if(input_sequence[i] == '-'){
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }else if(input_sequence[std::get<1>(x)] == '-'){
                    consensus_structure[i] = '.';
                    continue;   
                }
                else{
                    consensus_structure[i] = '.';
                    consensus_structure[std::get<1>(x)] = '.';
                    continue;
                }
            }
        }    
    }
    // Reports if not all pairs were closed
    if(!paren.empty() || !lts.empty() || !sb.empty() || !cb.empty()){
        std::cout << "Error in reported structure. More left pairings than right pairings" << std::endl;
        exit(0); 
    }
    // Erase Gaps
    for(int i= input_sequence.length()-1; i>=0;--i){
        if(input_sequence[i] == '-') consensus_structure.erase(i,1);
    }

    // Checks for pairs less than 3 distance away
    for(int i=0;i<length;i++){
        if(consensus_structure[i] == '(') {
            paren.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '<') {
            lts.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '[') {
            sb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        else if(consensus_structure[i] == '{') {
            cb.push_back(std::make_tuple(consensus_structure[i],i));
            continue;
        }
        std::tuple<char,int> x;
        bool close = false;
        if (consensus_structure[i] == ')' && !paren.empty()){
            x = paren[paren.size()-1];
            paren.erase(paren.begin()+(paren.size()-1));
            close = true;

        }
        else if (consensus_structure[i] == '>' && !lts.empty()){
            x = lts[lts.size()-1];
            lts.erase(lts.begin()+(lts.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == ']' && !sb.empty()){
            x = sb[sb.size()-1];
            sb.erase(sb.begin()+(sb.size()-1));
            close = true;
        }
        else if (consensus_structure[i] == '}' && !cb.empty()){
            x = cb[cb.size()-1];
            cb.erase(cb.begin()+(cb.size()-1));
            close = true;
        }
            
        if(close){
            if(i-std::get<1>(x) < 4){
                consensus_structure[i] = '.';
                consensus_structure[std::get<1>(x)] = '.';
                continue;  
            }
        }
    }

return consensus_structure;

}